

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subdivision.cpp
# Opt level: O3

void __thiscall
CatmullClarkSubdivider::InternSubdivide
          (CatmullClarkSubdivider *this,aiMesh **smesh,size_t nmesh,aiMesh **out,uint num)

{
  pointer ppVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint uVar4;
  uint uVar5;
  float fVar6;
  uint uVar7;
  float fVar8;
  mapped_type *pmVar9;
  _Base_ptr p_Var10;
  Logger *this_00;
  aiMesh *out_00;
  ulong *puVar11;
  aiVector3D *paVar12;
  void *__s;
  aiColor4D *__s_00;
  uint *puVar13;
  mapped_type *pmVar14;
  uint uVar15;
  ulong uVar16;
  aiFace *paVar17;
  ulong uVar18;
  long lVar19;
  aiMesh *paVar20;
  aiMesh **ppaVar21;
  int iVar22;
  aiMesh *paVar23;
  aiFace *paVar24;
  long lVar25;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  Vertex *pVVar29;
  size_t sVar30;
  ulong uVar31;
  ulong uVar32;
  bool bVar33;
  ai_real pRadius;
  float fVar34;
  uint uVar35;
  UIntVector maptbl;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  moffsets;
  UIntVector cntadjfac;
  UIntVector ofsadjvec;
  vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_> centroids;
  UIntVector faceadjac;
  EdgeMap edges;
  vector<std::pair<bool,_Assimp::Vertex>,_std::allocator<std::pair<bool,_Assimp::Vertex>_>_>
  new_points;
  SpatialSort spatial;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> tmp;
  Vertex F;
  Vertex R;
  uint local_aa4;
  int local_a78;
  undefined1 local_a68 [16];
  pointer local_a58;
  aiFace *local_a50;
  uint local_a44;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_a40;
  aiMesh **local_a28;
  size_t local_a20;
  aiMesh *local_a18;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_9f8;
  ulong local_9e0;
  ulong local_9d8;
  ulong local_9d0;
  vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_> local_9c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_9b0;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>,_std::_Select1st<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
  local_998;
  CatmullClarkSubdivider *local_968;
  ulong local_960;
  vector<std::pair<bool,_Assimp::Vertex>,_std::allocator<std::pair<bool,_Assimp::Vertex>_>_>
  local_958;
  SpatialSort local_940;
  undefined1 local_918 [112];
  ios_base local_8a8 [264];
  char *local_7a0 [2];
  long local_790 [32];
  Vertex local_690;
  Vertex local_580;
  Vertex local_470;
  Vertex local_360;
  Vertex local_250;
  Vertex local_140;
  
  if ((smesh == (aiMesh **)0x0) || (out == (aiMesh **)0x0)) {
    __assert_fail("__null != smesh && __null != out",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Subdivision.cpp"
                  ,0xec,
                  "void CatmullClarkSubdivider::InternSubdivide(const aiMesh *const *, size_t, aiMesh **, unsigned int)"
                 );
  }
  if (num == 0) {
    return;
  }
  local_a68 = (undefined1  [16])0x0;
  local_a58 = (pointer)0x0;
  local_a28 = out;
  local_968 = this;
  Assimp::SpatialSort::SpatialSort(&local_940);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_a40,nmesh,(allocator_type *)local_918);
  if (nmesh == 0) {
    local_aa4 = 0;
  }
  else {
    local_aa4 = 0;
    uVar35 = 0;
    sVar30 = 0;
    do {
      paVar23 = smesh[sVar30];
      Assimp::SpatialSort::Append(&local_940,paVar23->mVertices,paVar23->mNumVertices,0xc,false);
      local_a40.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start[sVar30].first = local_aa4;
      local_a40.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start[sVar30].second = uVar35;
      uVar2 = paVar23->mNumVertices;
      uVar3 = paVar23->mNumFaces;
      local_aa4 = local_aa4 + uVar3;
      uVar35 = uVar35 + uVar2;
      sVar30 = sVar30 + 1;
    } while (nmesh != sVar30);
  }
  Assimp::SpatialSort::Finalize(&local_940);
  pRadius = Assimp::ComputePositionEpsilon(smesh,nmesh);
  uVar35 = Assimp::SpatialSort::GenerateMappingTable
                     (&local_940,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a68,
                      pRadius);
  local_a50 = (aiFace *)CONCAT44(local_a50._4_4_,uVar35);
  std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>::vector
            (&local_9c8,(ulong)local_aa4,(allocator_type *)local_918);
  if (nmesh == 0) {
    local_998._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_998._M_impl.super__Rb_tree_header._M_header;
    local_998._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    uVar35 = 0;
    local_998._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_998._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_998._M_impl.super__Rb_tree_header._M_header._M_right =
         local_998._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  else {
    uVar35 = 0;
    sVar30 = 0;
    lVar19 = 0;
    do {
      paVar23 = smesh[sVar30];
      if (paVar23->mNumFaces != 0) {
        uVar16 = 0;
        do {
          paVar24 = paVar23->mFaces + uVar16;
          pVVar29 = local_9c8.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                    _M_impl.super__Vector_impl_data._M_start + lVar19;
          if (paVar23->mFaces[uVar16].mNumIndices == 0) {
            fVar34 = 0.0;
          }
          else {
            uVar31 = 0;
            do {
              Assimp::Vertex::Vertex((Vertex *)local_7a0,paVar23,paVar24->mIndices[uVar31]);
              Assimp::Vertex::BinaryOp<std::plus>((Vertex *)local_918,pVVar29,(Vertex *)local_7a0);
              memcpy(pVVar29,(Vertex *)local_918,0x110);
              uVar31 = uVar31 + 1;
            } while (uVar31 < paVar24->mNumIndices);
            fVar34 = (float)paVar24->mNumIndices;
          }
          Assimp::Vertex::BinaryOp<Assimp::Intern::multiplies>
                    ((Vertex *)local_918,pVVar29,1.0 / fVar34);
          memcpy(pVVar29,(Vertex *)local_918,0x110);
          uVar35 = uVar35 + paVar24->mNumIndices;
          uVar16 = uVar16 + 1;
          lVar19 = lVar19 + 1;
        } while (uVar16 < paVar23->mNumFaces);
      }
      sVar30 = sVar30 + 1;
    } while (sVar30 != nmesh);
    local_998._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_998._M_impl.super__Rb_tree_header._M_header;
    local_998._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    sVar30 = 0;
    local_998._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_998._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_998._M_impl.super__Rb_tree_header._M_header._M_right =
         local_998._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      paVar23 = smesh[sVar30];
      uVar26 = paVar23->mNumFaces;
      if (uVar26 != 0) {
        uVar16 = 0;
        local_a18 = paVar23;
        do {
          uVar15 = paVar23->mFaces[uVar16].mNumIndices;
          uVar31 = (ulong)uVar15;
          if (uVar15 != 0) {
            paVar24 = paVar23->mFaces + uVar16;
            uVar28 = 0;
            do {
              puVar13 = paVar24->mIndices;
              uVar26 = puVar13[uVar28];
              bVar33 = uVar28 != (int)uVar31 - 1;
              uVar28 = uVar28 + 1;
              uVar31 = 0;
              if (bVar33) {
                uVar31 = uVar28;
              }
              uVar15 = puVar13[uVar31];
              uVar4 = *(uint *)(local_a68._0_8_ +
                               (ulong)(local_a40.
                                       super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[sVar30].second +
                                      uVar26) * 4);
              uVar5 = *(uint *)(local_a68._0_8_ +
                               (ulong)(local_a40.
                                       super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[sVar30].second +
                                      uVar15) * 4);
              uVar7 = uVar5;
              if (uVar4 < uVar5) {
                uVar7 = uVar4;
              }
              if (uVar5 < uVar4) {
                uVar5 = uVar4;
              }
              local_918._0_8_ = CONCAT44(uVar7,uVar5);
              pmVar9 = std::
                       map<unsigned_long,_CatmullClarkSubdivider::Edge,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
                       ::operator[]((map<unsigned_long,_CatmullClarkSubdivider::Edge,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
                                     *)&local_998,(key_type_conflict *)local_918);
              paVar23 = local_a18;
              uVar5 = pmVar9->ref;
              uVar4 = uVar5 + 1;
              pmVar9->ref = uVar4;
              if (uVar4 < 3) {
                if (uVar5 == 0) {
                  Assimp::Vertex::Vertex((Vertex *)local_7a0,local_a18,uVar26);
                  Assimp::Vertex::Vertex(&local_690,paVar23,uVar15);
                  Assimp::Vertex::BinaryOp<std::plus>
                            ((Vertex *)local_918,(Vertex *)local_7a0,&local_690);
                  pVVar29 = &pmVar9->midpoint;
                  memcpy(pVVar29,(Vertex *)local_918,0x110);
                  memcpy(pmVar9,(Vertex *)local_918,0x110);
                  Assimp::Vertex::BinaryOp<Assimp::Intern::multiplies>
                            ((Vertex *)local_918,pVVar29,0.5);
                  memcpy(pVVar29,(Vertex *)local_918,0x110);
                }
                local_a78 = (int)uVar16;
                Assimp::Vertex::BinaryOp<std::plus>
                          ((Vertex *)local_918,&pmVar9->edge_point,
                           local_9c8.
                           super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                           _M_impl.super__Vector_impl_data._M_start +
                           (local_a40.
                            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[sVar30].first + local_a78));
                memcpy(pmVar9,(Vertex *)local_918,0x110);
              }
              uVar31 = (ulong)paVar24->mNumIndices;
            } while (uVar28 < uVar31);
            uVar26 = local_a18->mNumFaces;
            paVar23 = local_a18;
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 < uVar26);
      }
      sVar30 = sVar30 + 1;
    } while (sVar30 != nmesh);
    if ((_Rb_tree_header *)local_998._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_998._M_impl.super__Rb_tree_header) {
      iVar22 = 0;
      p_Var10 = local_998._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        uVar26 = *(uint *)&p_Var10[0x12]._M_parent;
        if (uVar26 < 2) {
          if (uVar26 == 0) {
            __assert_fail("(*it).second.ref",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Subdivision.cpp"
                          ,0x150,
                          "void CatmullClarkSubdivider::InternSubdivide(const aiMesh *const *, size_t, aiMesh **, unsigned int)"
                         );
          }
          iVar22 = iVar22 + 1;
        }
        Assimp::Vertex::BinaryOp<Assimp::Intern::multiplies>
                  ((Vertex *)local_918,(Vertex *)&p_Var10[1]._M_parent,1.0 / ((float)uVar26 + 2.0));
        memcpy(&p_Var10[1]._M_parent,(Vertex *)local_918,0x110);
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
      } while ((_Rb_tree_header *)p_Var10 != &local_998._M_impl.super__Rb_tree_header);
      if (iVar22 != 0) {
        this_00 = Assimp::DefaultLogger::get();
        Assimp::Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[31]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_918
                   ,(char (*) [31])"Catmull-Clark Subdivider: got ");
        std::ostream::_M_insert<unsigned_long>((ulong)local_918);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_918," bad edges touching only one face (totally ",0x2b);
        std::ostream::_M_insert<unsigned_long>((ulong)local_918);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_918," edges). ",9);
        std::__cxx11::stringbuf::str();
        Assimp::Logger::debug(this_00,local_7a0[0]);
        if ((float *)local_7a0[0] != (float *)((long)&((Vertex *)local_7a0)->normal + 4U)) {
          operator_delete(local_7a0[0],local_790[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_918);
        std::ios_base::~ios_base(local_8a8);
      }
    }
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_9b0,(ulong)uVar35,(allocator_type *)local_918);
  local_918._0_8_ = local_918._0_8_ & 0xffffffff00000000;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_a10,(long)(local_a68._8_8_ - local_a68._0_8_) >> 2,
             (value_type_conflict1 *)local_918,(allocator_type *)local_7a0);
  local_918._0_8_ = local_918._0_8_ & 0xffffffff00000000;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_9f8,((long)(local_a68._8_8_ - local_a68._0_8_) >> 2) + 1,
             (value_type_conflict1 *)local_918,(allocator_type *)local_7a0);
  if (nmesh != 0) {
    sVar30 = 0;
    do {
      paVar23 = smesh[sVar30];
      uVar35 = paVar23->mNumFaces;
      if (uVar35 != 0) {
        uVar16 = 0;
        do {
          if (paVar23->mFaces[uVar16].mNumIndices != 0) {
            paVar24 = paVar23->mFaces + uVar16;
            uVar31 = 0;
            do {
              local_a10.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start
              [*(uint *)(local_a68._0_8_ +
                        (ulong)(paVar24->mIndices[uVar31] +
                               local_a40.
                               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[sVar30].second) * 4)] =
                   local_a10.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start
                   [*(uint *)(local_a68._0_8_ +
                             (ulong)(paVar24->mIndices[uVar31] +
                                    local_a40.
                                    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[sVar30].second) * 4)]
                   + 1;
              uVar31 = uVar31 + 1;
            } while (uVar31 < paVar24->mNumIndices);
            uVar35 = paVar23->mNumFaces;
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 < uVar35);
      }
      sVar30 = sVar30 + 1;
    } while (sVar30 != nmesh);
  }
  if (local_a10.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_a10.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar35 = 0;
    uVar16 = 0;
    do {
      local_9f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar16 + 1] = uVar35;
      uVar35 = uVar35 + local_a10.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar16];
      uVar16 = uVar16 + 1;
    } while (uVar16 < (ulong)((long)local_a10.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_a10.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  if (nmesh != 0) {
    sVar30 = 0;
    do {
      paVar23 = smesh[sVar30];
      uVar35 = paVar23->mNumFaces;
      if (uVar35 != 0) {
        uVar16 = 0;
        do {
          if (paVar23->mFaces[uVar16].mNumIndices != 0) {
            paVar24 = paVar23->mFaces + uVar16;
            uVar31 = 0;
            do {
              uVar35 = local_a40.
                       super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[sVar30].first;
              uVar26 = local_9f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start
                       [*(pointer)(local_a68._0_8_ +
                                  (ulong)(paVar24->mIndices[uVar31] +
                                         local_a40.
                                         super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[sVar30].second) *
                                  4) + 1];
              local_9f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start
              [*(pointer)(local_a68._0_8_ +
                         (ulong)(paVar24->mIndices[uVar31] +
                                local_a40.
                                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[sVar30].second) * 4) + 1]
                   = uVar26 + 1;
              local_9b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar26] = uVar35 + (int)uVar16;
              uVar31 = uVar31 + 1;
            } while (uVar31 < paVar24->mNumIndices);
            uVar35 = paVar23->mNumFaces;
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 < uVar35);
      }
      sVar30 = sVar30 + 1;
    } while (sVar30 != nmesh);
  }
  lVar19 = (long)local_9f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_9f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2;
  if (lVar19 != 1) {
    lVar25 = 0;
    do {
      if ((ulong)local_a10.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar25] != 0) {
        uVar16 = 0;
        do {
          uVar35 = local_9b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start
                   [local_9f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar25] + (int)uVar16];
          if (local_aa4 <= uVar35) {
            __assert_fail("fidx < totfaces",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Subdivision.cpp"
                          ,0x185,
                          "void CatmullClarkSubdivider::InternSubdivide(const aiMesh *const *, size_t, aiMesh **, unsigned int)"
                         );
          }
          if (1 < nmesh) {
            lVar27 = 0;
            while (local_a40.
                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar27 + 1].first <= uVar35) {
              lVar27 = lVar27 + 1;
              if (nmesh - 1 == lVar27) goto LAB_00653336;
            }
            uVar35 = uVar35 - local_a40.
                              super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar27].first;
            uVar31 = (ulong)smesh[lVar27]->mFaces[uVar35].mNumIndices;
            if (uVar31 == 0) goto LAB_00653f83;
            uVar28 = 0;
            while (*(pointer)(local_a68._0_8_ +
                             (ulong)(smesh[lVar27]->mFaces[uVar35].mIndices[uVar28] +
                                    local_a40.
                                    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[lVar27].second) * 4)
                   != (uint)lVar25) {
              uVar28 = uVar28 + 1;
              if (uVar31 == uVar28) {
LAB_00653f83:
                __assert_fail("haveit",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Subdivision.cpp"
                              ,0x193,
                              "void CatmullClarkSubdivider::InternSubdivide(const aiMesh *const *, size_t, aiMesh **, unsigned int)"
                             );
              }
            }
          }
LAB_00653336:
          uVar16 = uVar16 + 1;
        } while (uVar16 != local_a10.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar25]);
      }
      lVar25 = lVar25 + 1;
    } while (lVar25 != lVar19 + -1);
  }
  uVar16 = (ulong)local_a50 & 0xffffffff;
  memset(local_918 + 4,0,0x110);
  local_918._0_8_ = local_918._0_8_ & 0xffffffffffffff00;
  std::vector<std::pair<bool,_Assimp::Vertex>,_std::allocator<std::pair<bool,_Assimp::Vertex>_>_>::
  vector(&local_958,uVar16,(value_type *)local_918,(allocator_type *)local_7a0);
  if (nmesh != 0) {
    sVar30 = 0;
    do {
      paVar23 = smesh[sVar30];
      local_a20 = sVar30;
      out_00 = (aiMesh *)operator_new(0x520);
      out_00->mPrimitiveTypes = 0;
      out_00->mNumVertices = 0;
      uVar16 = 0;
      out_00->mNumFaces = 0;
      memset(&out_00->mVertices,0,0xcc);
      out_00->mBones = (aiBone **)0x0;
      out_00->mMaterialIndex = 0;
      (out_00->mName).length = 0;
      (out_00->mName).data[0] = '\0';
      memset((out_00->mName).data + 1,0x1b,0x3ff);
      out_00->mNumAnimMeshes = 0;
      out_00->mAnimMeshes = (aiAnimMesh **)0x0;
      out_00->mMethod = 0;
      (out_00->mAABB).mMin.x = 0.0;
      *(undefined1 (*) [16])&(out_00->mAABB).mMin.y = (undefined1  [16])0x0;
      (out_00->mAABB).mMax.z = 0.0;
      memset(out_00->mColors,0,0xa0);
      local_a28[local_a20] = out_00;
      if (paVar23->mNumFaces != 0) {
        lVar19 = 0;
        uVar16 = 0;
        uVar31 = 0;
        do {
          uVar35 = (int)uVar16 + *(int *)((long)&paVar23->mFaces->mNumIndices + lVar19);
          uVar16 = (ulong)uVar35;
          out_00->mNumFaces = uVar35;
          uVar31 = uVar31 + 1;
          lVar19 = lVar19 + 0x10;
        } while (uVar31 < paVar23->mNumFaces);
      }
      puVar11 = (ulong *)operator_new__(uVar16 * 0x10 + 8);
      *puVar11 = uVar16;
      paVar24 = (aiFace *)(puVar11 + 1);
      if (uVar16 != 0) {
        paVar17 = paVar24;
        do {
          paVar17->mNumIndices = 0;
          paVar17->mIndices = (uint *)0x0;
          paVar17 = paVar17 + 1;
        } while (paVar17 != paVar24 + uVar16);
      }
      out_00->mFaces = paVar24;
      uVar35 = (int)uVar16 << 2;
      out_00->mNumVertices = uVar35;
      uVar31 = (ulong)uVar35 * 0xc;
      paVar12 = (aiVector3D *)operator_new__(uVar31);
      if ((uVar16 & 0x3fffffff) != 0) {
        memset(paVar12,0,((uVar31 - 0xc) / 0xc) * 0xc + 0xc);
      }
      out_00->mVertices = paVar12;
      out_00->mPrimitiveTypes = 8;
      out_00->mMaterialIndex = paVar23->mMaterialIndex;
      if ((paVar23->mNormals != (aiVector3D *)0x0) && (paVar23->mNumVertices != 0)) {
        paVar12 = (aiVector3D *)operator_new__(uVar31);
        if ((uVar16 & 0x3fffffff) != 0) {
          memset(paVar12,0,((uVar31 - 0xc) / 0xc) * 0xc + 0xc);
        }
        out_00->mNormals = paVar12;
      }
      if (((paVar23->mTangents != (aiVector3D *)0x0) && (paVar23->mBitangents != (aiVector3D *)0x0))
         && (paVar23->mNumVertices != 0)) {
        paVar12 = (aiVector3D *)operator_new__(uVar31);
        if ((uVar16 & 0x3fffffff) != 0) {
          memset(paVar12,0,((uVar31 - 0xc) / 0xc) * 0xc + 0xc);
        }
        out_00->mTangents = paVar12;
        paVar12 = (aiVector3D *)operator_new__(uVar31);
        if ((uVar16 & 0x3fffffff) != 0) {
          memset(paVar12,0,((uVar31 - 0xc) / 0xc) * 0xc + 0xc);
        }
        out_00->mBitangents = paVar12;
      }
      lVar19 = 0;
      do {
        if ((*(long *)((long)paVar23->mTextureCoords + lVar19 * 2) == 0) ||
           (paVar23->mNumVertices == 0)) break;
        __s = operator_new__(uVar31);
        if (uVar35 != 0) {
          memset(__s,0,((uVar31 - 0xc) / 0xc) * 0xc + 0xc);
        }
        *(void **)((long)out_00->mTextureCoords + lVar19 * 2) = __s;
        *(undefined4 *)((long)out_00->mNumUVComponents + lVar19) =
             *(undefined4 *)((long)paVar23->mNumUVComponents + lVar19);
        lVar19 = lVar19 + 4;
      } while (lVar19 != 0x20);
      uVar16 = (ulong)uVar35 << 4;
      lVar19 = 6;
      do {
        if ((paVar23->mColors[lVar19 + -6] == (aiColor4D *)0x0) || (paVar23->mNumVertices == 0))
        break;
        __s_00 = (aiColor4D *)operator_new__(uVar16);
        if (uVar35 != 0) {
          memset(__s_00,0,uVar16);
        }
        out_00->mColors[lVar19 + -6] = __s_00;
        lVar19 = lVar19 + 1;
      } while (lVar19 != 0xe);
      out_00->mNumVertices = uVar35;
      uVar35 = paVar23->mNumFaces;
      if (uVar35 != 0) {
        uVar16 = 0;
        uVar26 = 0;
        uVar31 = 0;
        do {
          if (paVar23->mFaces[uVar16].mNumIndices != 0) {
            paVar24 = paVar23->mFaces + uVar16;
            uVar28 = 0;
            local_9d8 = uVar16;
            do {
              paVar17 = out_00->mFaces;
              paVar17[uVar26].mNumIndices = 4;
              local_a44 = uVar26;
              puVar13 = (uint *)operator_new__(0x10);
              sVar30 = local_a20;
              local_a50 = paVar17 + uVar26;
              local_a50->mIndices = puVar13;
              uVar35 = local_a40.
                       super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[local_a20].first;
              uVar26 = (uint)uVar31;
              *puVar13 = uVar26;
              Assimp::Vertex::SortBack
                        (local_9c8.
                         super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl
                         .super__Vector_impl_data._M_start + (uVar35 + (int)local_9d8),out_00,uVar26
                        );
              local_960 = uVar28 + 1;
              uVar16 = 0;
              if (uVar28 != paVar24->mNumIndices - 1) {
                uVar16 = local_960 & 0xffffffff;
              }
              fVar34 = *(float *)(local_a68._0_8_ +
                                 (ulong)(paVar24->mIndices[uVar28] +
                                        local_a40.
                                        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[sVar30].second) *
                                 4);
              fVar6 = *(float *)(local_a68._0_8_ +
                                (ulong)(local_a40.
                                        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[sVar30].second +
                                       paVar24->mIndices[uVar16]) * 4);
              fVar8 = fVar6;
              if ((uint)fVar34 < (uint)fVar6) {
                fVar8 = fVar34;
              }
              if ((uint)fVar6 < (uint)fVar34) {
                fVar6 = fVar34;
              }
              local_918._0_8_ = CONCAT44(fVar8,fVar6);
              pmVar9 = std::
                       map<unsigned_long,_CatmullClarkSubdivider::Edge,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
                       ::operator[]((map<unsigned_long,_CatmullClarkSubdivider::Edge,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
                                     *)&local_998,(key_type_conflict *)local_918);
              sVar30 = local_a20;
              uVar35 = (uint)uVar28;
              if (uVar28 == 0) {
                uVar35 = paVar24->mNumIndices;
              }
              uVar15 = *(uint *)(local_a68._0_8_ +
                                (ulong)(paVar24->mIndices[uVar28] +
                                       local_a40.
                                       super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[local_a20].second)
                                * 4);
              uVar35 = *(uint *)(local_a68._0_8_ +
                                (ulong)(local_a40.
                                        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[local_a20].second
                                       + paVar24->mIndices[uVar35 - 1]) * 4);
              uVar4 = uVar35;
              if (uVar15 < uVar35) {
                uVar4 = uVar15;
              }
              if (uVar35 < uVar15) {
                uVar35 = uVar15;
              }
              local_918._0_8_ = CONCAT44(uVar4,uVar35);
              pmVar14 = std::
                        map<unsigned_long,_CatmullClarkSubdivider::Edge,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
                        ::operator[]((map<unsigned_long,_CatmullClarkSubdivider::Edge,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
                                      *)&local_998,(key_type_conflict *)local_918);
              paVar17 = local_a50;
              local_a50->mIndices[3] = uVar26 + 1;
              local_9d0 = uVar28;
              Assimp::Vertex::SortBack(&pmVar9->edge_point,out_00,uVar26 + 1);
              paVar17->mIndices[1] = uVar26 + 2;
              Assimp::Vertex::SortBack(&pmVar14->edge_point,out_00,uVar26 + 2);
              uVar26 = local_a44;
              uVar35 = *(uint *)(local_a68._0_8_ +
                                (ulong)(paVar24->mIndices[local_9d0] +
                                       local_a40.
                                       super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[sVar30].second) * 4
                                );
              uVar16 = (ulong)uVar35;
              ppVar1 = local_958.
                       super__Vector_base<std::pair<bool,_Assimp::Vertex>,_std::allocator<std::pair<bool,_Assimp::Vertex>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar16;
              if (local_958.
                  super__Vector_base<std::pair<bool,_Assimp::Vertex>,_std::allocator<std::pair<bool,_Assimp::Vertex>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar16].first == false) {
                ppVar1->first = true;
                uVar28 = (ulong)local_a10.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar16];
                local_9e0 = uVar31;
                if (uVar28 < 3) {
                  Assimp::Vertex::Vertex((Vertex *)local_918,paVar23,paVar24->mIndices[local_9d0]);
                  memcpy(&ppVar1->second,(Vertex *)local_918,0x110);
                  uVar31 = local_9e0;
                  paVar17 = local_a50;
                }
                else {
                  paVar20 = (aiMesh *)
                            (local_9b0.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start +
                            local_9f8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar16]);
                  memset((Vertex *)local_7a0,0,0x110);
                  memset(&local_690,0,0x110);
                  uVar31 = 0;
                  local_a18 = paVar20;
                  do {
                    paVar20 = local_a18;
                    uVar26 = *(uint *)((long)local_a18->mColors + uVar31 * 4 + -0x30);
                    if (local_aa4 <= uVar26) {
                      __assert_fail("adj[o] < totfaces",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Subdivision.cpp"
                                    ,0x202,
                                    "void CatmullClarkSubdivider::InternSubdivide(const aiMesh *const *, size_t, aiMesh **, unsigned int)"
                                   );
                    }
                    Assimp::Vertex::BinaryOp<std::plus>
                              ((Vertex *)local_918,(Vertex *)local_7a0,
                               local_9c8.
                               super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                               _M_impl.super__Vector_impl_data._M_start + uVar26);
                    memcpy((Vertex *)local_7a0,(Vertex *)local_918,0x110);
                    uVar26 = *(uint *)((long)paVar20->mColors + uVar31 * 4 + -0x30);
                    if (uVar26 < (local_a40.
                                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->first) {
                      uVar32 = 0;
                      ppaVar21 = smesh;
LAB_00653ac0:
                      paVar20 = *ppaVar21;
                    }
                    else {
                      uVar32 = 1;
                      do {
                        sVar30 = nmesh;
                        if ((nmesh == uVar32) ||
                           (sVar30 = uVar32,
                           uVar26 < local_a40.
                                    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar32].first)) {
                          ppaVar21 = smesh + (sVar30 - 1);
                          uVar32 = sVar30 - 1;
                          goto LAB_00653ac0;
                        }
                        uVar32 = uVar32 + 1;
                      } while (uVar32 <= nmesh);
                      paVar20 = (aiMesh *)0x0;
                    }
                    uVar26 = uVar26 - local_a40.
                                      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar32].first;
                    if (paVar20->mNumFaces <= uVar26) {
                      __assert_fail("adj[o]-moffsets[nidx].first < mp->mNumFaces",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Subdivision.cpp"
                                    ,0x215,
                                    "void CatmullClarkSubdivider::InternSubdivide(const aiMesh *const *, size_t, aiMesh **, unsigned int)"
                                   );
                    }
                    uVar15 = paVar20->mFaces[uVar26].mNumIndices;
                    if (uVar15 == 0) {
LAB_00653e99:
                      __assert_fail("haveit",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Subdivision.cpp"
                                    ,0x232,
                                    "void CatmullClarkSubdivider::InternSubdivide(const aiMesh *const *, size_t, aiMesh **, unsigned int)"
                                   );
                    }
                    paVar17 = paVar20->mFaces + uVar26;
                    lVar19 = 0;
                    while (*(uint *)(local_a68._0_8_ +
                                    (ulong)(paVar17->mIndices[lVar19] +
                                           local_a40.
                                           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar32].second)
                                    * 4) != uVar35) {
                      lVar19 = lVar19 + 1;
                      if (uVar15 == (uint)lVar19) goto LAB_00653e99;
                    }
                    uVar26 = (uint)lVar19;
                    if (uVar26 != 0) {
                      uVar15 = uVar26;
                    }
                    uVar15 = *(uint *)(local_a68._0_8_ +
                                      (ulong)(local_a40.
                                              super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[uVar32].
                                              second + paVar17->mIndices[uVar15 - 1]) * 4);
                    uVar18 = (ulong)uVar15;
                    if (uVar35 < uVar15) {
                      uVar18 = uVar16;
                    }
                    if (uVar15 < uVar35) {
                      uVar15 = uVar35;
                    }
                    local_918._0_8_ = uVar18 << 0x20 | (ulong)uVar15;
                    pmVar9 = std::
                             map<unsigned_long,_CatmullClarkSubdivider::Edge,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
                             ::operator[]((map<unsigned_long,_CatmullClarkSubdivider::Edge,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
                                           *)&local_998,(key_type_conflict *)local_918);
                    uVar15 = uVar26 + 1;
                    if (uVar26 - paVar17->mNumIndices == -1) {
                      uVar15 = 0;
                    }
                    uVar26 = *(uint *)(local_a68._0_8_ +
                                      (ulong)(paVar17->mIndices[uVar15] +
                                             local_a40.
                                             super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[uVar32].
                                             second) * 4);
                    uVar15 = uVar26;
                    if (uVar35 < uVar26) {
                      uVar15 = uVar35;
                    }
                    uVar32 = (ulong)uVar26;
                    if (uVar26 < uVar35) {
                      uVar32 = uVar16;
                    }
                    local_918._0_8_ = (ulong)uVar15 << 0x20 | uVar32;
                    pmVar14 = std::
                              map<unsigned_long,_CatmullClarkSubdivider::Edge,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
                              ::operator[]((map<unsigned_long,_CatmullClarkSubdivider::Edge,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
                                            *)&local_998,(key_type_conflict *)local_918);
                    Assimp::Vertex::BinaryOp<std::plus>
                              (&local_470,&pmVar9->midpoint,&pmVar14->midpoint);
                    Assimp::Vertex::BinaryOp<std::plus>((Vertex *)local_918,&local_690,&local_470);
                    memcpy(&local_690,(Vertex *)local_918,0x110);
                    uVar31 = uVar31 + 1;
                  } while (uVar31 != uVar28);
                  Assimp::Vertex::Vertex(&local_140,paVar23,paVar24->mIndices[local_9d0]);
                  fVar34 = (float)uVar28;
                  Assimp::Vertex::BinaryOp<Assimp::Intern::multiplies>
                            (&local_580,&local_140,(fVar34 + -3.0) / fVar34);
                  fVar34 = 1.0 / (fVar34 * fVar34);
                  Assimp::Vertex::BinaryOp<Assimp::Intern::multiplies>(&local_250,&local_690,fVar34)
                  ;
                  Assimp::Vertex::BinaryOp<std::plus>(&local_470,&local_580,&local_250);
                  Assimp::Vertex::BinaryOp<Assimp::Intern::multiplies>
                            (&local_360,(Vertex *)local_7a0,fVar34);
                  Assimp::Vertex::BinaryOp<std::plus>((Vertex *)local_918,&local_470,&local_360);
                  memcpy(&ppVar1->second,(Vertex *)local_918,0x110);
                  uVar31 = local_9e0;
                  paVar17 = local_a50;
                  uVar26 = local_a44;
                }
              }
              uVar26 = uVar26 + 1;
              uVar35 = (int)uVar31 + 3;
              uVar31 = (ulong)((int)uVar31 + 4);
              paVar17->mIndices[2] = uVar35;
              Assimp::Vertex::SortBack(&ppVar1->second,out_00,uVar35);
              uVar28 = local_960;
            } while (local_960 < paVar24->mNumIndices);
            uVar35 = paVar23->mNumFaces;
            uVar16 = local_9d8;
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 < uVar35);
      }
      sVar30 = local_a20 + 1;
    } while (sVar30 != nmesh);
  }
  if (local_958.
      super__Vector_base<std::pair<bool,_Assimp::Vertex>,_std::allocator<std::pair<bool,_Assimp::Vertex>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_958.
                    super__Vector_base<std::pair<bool,_Assimp::Vertex>,_std::allocator<std::pair<bool,_Assimp::Vertex>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_958.
                          super__Vector_base<std::pair<bool,_Assimp::Vertex>,_std::allocator<std::pair<bool,_Assimp::Vertex>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_958.
                          super__Vector_base<std::pair<bool,_Assimp::Vertex>,_std::allocator<std::pair<bool,_Assimp::Vertex>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_9f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_9f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_9f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_9f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a10.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a10.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a10.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a10.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_9b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_9b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_9b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_9b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>,_std::_Select1st<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
  ::~_Rb_tree(&local_998);
  if (num != 1) {
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::vector
              ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_918,nmesh,
               (allocator_type *)local_7a0);
    InternSubdivide(local_968,local_a28,nmesh,(aiMesh **)local_918._0_8_,num - 1);
    if (nmesh == 0) {
      if ((aiMesh **)local_918._0_8_ == (aiMesh **)0x0) goto LAB_00653ed5;
    }
    else {
      sVar30 = 0;
      do {
        paVar23 = local_a28[sVar30];
        if (paVar23 != (aiMesh *)0x0) {
          aiMesh::~aiMesh(paVar23);
        }
        operator_delete(paVar23,0x520);
        local_a28[sVar30] = *(aiMesh **)(local_918._0_8_ + sVar30 * 8);
        sVar30 = sVar30 + 1;
      } while (nmesh != sVar30);
    }
    operator_delete((void *)local_918._0_8_,local_918._16_8_ - local_918._0_8_);
  }
LAB_00653ed5:
  if (local_9c8.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_9c8.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_9c8.
                          super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_9c8.
                          super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a40.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a40.
                    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a40.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  Assimp::SpatialSort::~SpatialSort(&local_940);
  if ((pointer)local_a68._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_a68._0_8_,(long)local_a58 - local_a68._0_8_);
  }
  return;
}

Assistant:

void CatmullClarkSubdivider::InternSubdivide (
    const aiMesh* const * smesh,
    size_t nmesh,
    aiMesh** out,
    unsigned int num
    )
{
    ai_assert(NULL != smesh && NULL != out);
    INIT_EDGE_HASH_TEMPORARIES();

    // no subdivision requested or end of recursive refinement
    if (!num) {
        return;
    }

    UIntVector maptbl;
    SpatialSort spatial;

    // ---------------------------------------------------------------------
    // 0. Offset table to index all meshes continuously, generate a spatially
    // sorted representation of all vertices in all meshes.
    // ---------------------------------------------------------------------
    typedef std::pair<unsigned int,unsigned int> IntPair;
    std::vector<IntPair> moffsets(nmesh);
    unsigned int totfaces = 0, totvert = 0;
    for (size_t t = 0; t < nmesh; ++t) {
        const aiMesh* mesh = smesh[t];

        spatial.Append(mesh->mVertices,mesh->mNumVertices,sizeof(aiVector3D),false);
        moffsets[t] = IntPair(totfaces,totvert);

        totfaces += mesh->mNumFaces;
        totvert  += mesh->mNumVertices;
    }

    spatial.Finalize();
    const unsigned int num_unique = spatial.GenerateMappingTable(maptbl,ComputePositionEpsilon(smesh,nmesh));


#define FLATTEN_VERTEX_IDX(mesh_idx, vert_idx) (moffsets[mesh_idx].second+vert_idx)
#define   FLATTEN_FACE_IDX(mesh_idx, face_idx) (moffsets[mesh_idx].first+face_idx)

    // ---------------------------------------------------------------------
    // 1. Compute the centroid point for all faces
    // ---------------------------------------------------------------------
    std::vector<Vertex> centroids(totfaces);
    unsigned int nfacesout = 0;
    for (size_t t = 0, n = 0; t < nmesh; ++t) {
        const aiMesh* mesh = smesh[t];
        for (unsigned int i = 0; i < mesh->mNumFaces;++i,++n)
        {
            const aiFace& face = mesh->mFaces[i];
            Vertex& c = centroids[n];

            for (unsigned int a = 0; a < face.mNumIndices;++a) {
                c += Vertex(mesh,face.mIndices[a]);
            }

            c /= static_cast<float>(face.mNumIndices);
            nfacesout += face.mNumIndices;
        }
    }

    {
    // we want edges to go away before the recursive calls so begin a new scope
    EdgeMap edges;

    // ---------------------------------------------------------------------
    // 2. Set each edge point to be the average of all neighbouring
    // face points and original points. Every edge exists twice
    // if there is a neighboring face.
    // ---------------------------------------------------------------------
    for (size_t t = 0; t < nmesh; ++t) {
        const aiMesh* mesh = smesh[t];

        for (unsigned int i = 0; i < mesh->mNumFaces;++i)   {
            const aiFace& face = mesh->mFaces[i];

            for (unsigned int p =0; p< face.mNumIndices; ++p) {
                const unsigned int id[] = {
                    face.mIndices[p],
                    face.mIndices[p==face.mNumIndices-1?0:p+1]
                };
                const unsigned int mp[] = {
                    maptbl[FLATTEN_VERTEX_IDX(t,id[0])],
                    maptbl[FLATTEN_VERTEX_IDX(t,id[1])]
                };

                Edge& e = edges[MAKE_EDGE_HASH(mp[0],mp[1])];
                e.ref++;
                if (e.ref<=2) {
                    if (e.ref==1) { // original points (end points) - add only once
                        e.edge_point = e.midpoint = Vertex(mesh,id[0])+Vertex(mesh,id[1]);
                        e.midpoint *= 0.5f;
                    }
                    e.edge_point += centroids[FLATTEN_FACE_IDX(t,i)];
                }
            }
        }
    }

    // ---------------------------------------------------------------------
    // 3. Normalize edge points
    // ---------------------------------------------------------------------
    {unsigned int bad_cnt = 0;
    for (EdgeMap::iterator it = edges.begin(); it != edges.end(); ++it) {
        if ((*it).second.ref < 2) {
            ai_assert((*it).second.ref);
            ++bad_cnt;
        }
        (*it).second.edge_point *= 1.f/((*it).second.ref+2.f);
    }

    if (bad_cnt) {
        // Report the number of bad edges. bad edges are referenced by less than two
        // faces in the mesh. They occur at outer model boundaries in non-closed
        // shapes.
        ASSIMP_LOG_DEBUG_F("Catmull-Clark Subdivider: got ", bad_cnt, " bad edges touching only one face (totally ", 
            static_cast<unsigned int>(edges.size()), " edges). ");
    }}

    // ---------------------------------------------------------------------
    // 4. Compute a vertex-face adjacency table. We can't reuse the code
    // from VertexTriangleAdjacency because we need the table for multiple
    // meshes and out vertex indices need to be mapped to distinct values
    // first.
    // ---------------------------------------------------------------------
    UIntVector faceadjac(nfacesout), cntadjfac(maptbl.size(),0), ofsadjvec(maptbl.size()+1,0); {
    for (size_t t = 0; t < nmesh; ++t) {
        const aiMesh* const minp = smesh[t];
        for (unsigned int i = 0; i < minp->mNumFaces; ++i) {

            const aiFace& f = minp->mFaces[i];
            for (unsigned int n = 0; n < f.mNumIndices; ++n) {
                ++cntadjfac[maptbl[FLATTEN_VERTEX_IDX(t,f.mIndices[n])]];
            }
        }
    }
    unsigned int cur = 0;
    for (size_t i = 0; i < cntadjfac.size(); ++i) {
        ofsadjvec[i+1] = cur;
        cur += cntadjfac[i];
    }
    for (size_t t = 0; t < nmesh; ++t) {
        const aiMesh* const minp = smesh[t];
        for (unsigned int i = 0; i < minp->mNumFaces; ++i) {

            const aiFace& f = minp->mFaces[i];
            for (unsigned int n = 0; n < f.mNumIndices; ++n) {
                faceadjac[ofsadjvec[1+maptbl[FLATTEN_VERTEX_IDX(t,f.mIndices[n])]]++] = FLATTEN_FACE_IDX(t,i);
            }
        }
    }

    // check the other way round for consistency
#ifdef ASSIMP_BUILD_DEBUG

    for (size_t t = 0; t < ofsadjvec.size()-1; ++t) {
        for (unsigned int m = 0; m <  cntadjfac[t]; ++m) {
            const unsigned int fidx = faceadjac[ofsadjvec[t]+m];
            ai_assert(fidx < totfaces);
            for (size_t n = 1; n < nmesh; ++n) {

                if (moffsets[n].first > fidx) {
                    const aiMesh* msh = smesh[--n];
                    const aiFace& f = msh->mFaces[fidx-moffsets[n].first];

                    bool haveit = false;
                    for (unsigned int i = 0; i < f.mNumIndices; ++i) {
                        if (maptbl[FLATTEN_VERTEX_IDX(n,f.mIndices[i])]==(unsigned int)t) {
                            haveit = true;
                            break;
                        }
                    }
                    ai_assert(haveit);
                    if (!haveit) {
                        ASSIMP_LOG_DEBUG("Catmull-Clark Subdivider: Index not used");
                    }
                    break;
                }
            }
        }
    }

#endif
    }

#define GET_ADJACENT_FACES_AND_CNT(vidx,fstartout,numout) \
    fstartout = &faceadjac[ofsadjvec[vidx]], numout = cntadjfac[vidx]

    typedef std::pair<bool,Vertex> TouchedOVertex;
    std::vector<TouchedOVertex > new_points(num_unique,TouchedOVertex(false,Vertex()));
    // ---------------------------------------------------------------------
    // 5. Spawn a quad from each face point to the corresponding edge points
    // the original points being the fourth quad points.
    // ---------------------------------------------------------------------
    for (size_t t = 0; t < nmesh; ++t) {
        const aiMesh* const minp = smesh[t];
        aiMesh* const mout = out[t] = new aiMesh();

        for (unsigned int a  = 0; a < minp->mNumFaces; ++a) {
            mout->mNumFaces += minp->mFaces[a].mNumIndices;
        }

        // We need random access to the old face buffer, so reuse is not possible.
        mout->mFaces = new aiFace[mout->mNumFaces];

        mout->mNumVertices = mout->mNumFaces*4;
        mout->mVertices = new aiVector3D[mout->mNumVertices];

        // quads only, keep material index
        mout->mPrimitiveTypes = aiPrimitiveType_POLYGON;
        mout->mMaterialIndex = minp->mMaterialIndex;

        if (minp->HasNormals()) {
            mout->mNormals = new aiVector3D[mout->mNumVertices];
        }

        if (minp->HasTangentsAndBitangents()) {
            mout->mTangents = new aiVector3D[mout->mNumVertices];
            mout->mBitangents = new aiVector3D[mout->mNumVertices];
        }

        for(unsigned int i = 0; minp->HasTextureCoords(i); ++i) {
            mout->mTextureCoords[i] = new aiVector3D[mout->mNumVertices];
            mout->mNumUVComponents[i] = minp->mNumUVComponents[i];
        }

        for(unsigned int i = 0; minp->HasVertexColors(i); ++i) {
            mout->mColors[i] = new aiColor4D[mout->mNumVertices];
        }

        mout->mNumVertices = mout->mNumFaces<<2u;
        for (unsigned int i = 0, v = 0, n = 0; i < minp->mNumFaces;++i) {

            const aiFace& face = minp->mFaces[i];
            for (unsigned int a = 0; a < face.mNumIndices;++a)  {

                // Get a clean new face.
                aiFace& faceOut = mout->mFaces[n++];
                faceOut.mIndices = new unsigned int [faceOut.mNumIndices = 4];

                // Spawn a new quadrilateral (ccw winding) for this original point between:
                // a) face centroid
                centroids[FLATTEN_FACE_IDX(t,i)].SortBack(mout,faceOut.mIndices[0]=v++);

                // b) adjacent edge on the left, seen from the centroid
                const Edge& e0 = edges[MAKE_EDGE_HASH(maptbl[FLATTEN_VERTEX_IDX(t,face.mIndices[a])],
                    maptbl[FLATTEN_VERTEX_IDX(t,face.mIndices[a==face.mNumIndices-1?0:a+1])
                    ])];  // fixme: replace with mod face.mNumIndices?

                // c) adjacent edge on the right, seen from the centroid
                const Edge& e1 = edges[MAKE_EDGE_HASH(maptbl[FLATTEN_VERTEX_IDX(t,face.mIndices[a])],
                    maptbl[FLATTEN_VERTEX_IDX(t,face.mIndices[!a?face.mNumIndices-1:a-1])
                    ])];  // fixme: replace with mod face.mNumIndices?

                e0.edge_point.SortBack(mout,faceOut.mIndices[3]=v++);
                e1.edge_point.SortBack(mout,faceOut.mIndices[1]=v++);

                // d= original point P with distinct index i
                // F := 0
                // R := 0
                // n := 0
                // for each face f containing i
                //    F := F+ centroid of f
                //    R := R+ midpoint of edge of f from i to i+1
                //    n := n+1
                //
                // (F+2R+(n-3)P)/n
                const unsigned int org = maptbl[FLATTEN_VERTEX_IDX(t,face.mIndices[a])];
                TouchedOVertex& ov = new_points[org];

                if (!ov.first) {
                    ov.first = true;

                    const unsigned int* adj; unsigned int cnt;
                    GET_ADJACENT_FACES_AND_CNT(org,adj,cnt);

                    if (cnt < 3) {
                        ov.second = Vertex(minp,face.mIndices[a]);
                    }
                    else {

                        Vertex F,R;
                        for (unsigned int o = 0; o < cnt; ++o) {
                            ai_assert(adj[o] < totfaces);
                            F += centroids[adj[o]];

                            // adj[0] is a global face index - search the face in the mesh list
                            const aiMesh* mp = NULL;
                            size_t nidx;

                            if (adj[o] < moffsets[0].first) {
                                mp = smesh[nidx=0];
                            }
                            else {
                                for (nidx = 1; nidx<= nmesh; ++nidx) {
                                    if (nidx == nmesh ||moffsets[nidx].first > adj[o]) {
                                        mp = smesh[--nidx];
                                        break;
                                    }
                                }
                            }

                            ai_assert(adj[o]-moffsets[nidx].first < mp->mNumFaces);
                            const aiFace& f = mp->mFaces[adj[o]-moffsets[nidx].first];
                            bool haveit = false;

                            // find our original point in the face
                            for (unsigned int m = 0; m < f.mNumIndices; ++m) {
                                if (maptbl[FLATTEN_VERTEX_IDX(nidx,f.mIndices[m])] == org) {

                                    // add *both* edges. this way, we can be sure that we add
                                    // *all* adjacent edges to R. In a closed shape, every
                                    // edge is added twice - so we simply leave out the
                                    // factor 2.f in the amove formula and get the right
                                    // result.

                                    const Edge& c0 = edges[MAKE_EDGE_HASH(org,maptbl[FLATTEN_VERTEX_IDX(
                                        nidx,f.mIndices[!m?f.mNumIndices-1:m-1])])];
                                    // fixme: replace with mod face.mNumIndices?

                                    const Edge& c1 = edges[MAKE_EDGE_HASH(org,maptbl[FLATTEN_VERTEX_IDX(
                                        nidx,f.mIndices[m==f.mNumIndices-1?0:m+1])])];
                                    // fixme: replace with mod face.mNumIndices?
                                    R += c0.midpoint+c1.midpoint;

                                    haveit = true;
                                    break;
                                }
                            }

                            // this invariant *must* hold if the vertex-to-face adjacency table is valid
                            ai_assert(haveit);
                            if ( !haveit ) {
                                ASSIMP_LOG_WARN( "OBJ: no name for material library specified." );
                            }
                        }

                        const float div = static_cast<float>(cnt), divsq = 1.f/(div*div);
                        ov.second = Vertex(minp,face.mIndices[a])*((div-3.f) / div) + R*divsq + F*divsq;
                    }
                }
                ov.second.SortBack(mout,faceOut.mIndices[2]=v++);
            }
        }
    }
    }  // end of scope for edges, freeing its memory

    // ---------------------------------------------------------------------
    // 7. Apply the next subdivision step.
    // ---------------------------------------------------------------------
    if (num != 1) {
        std::vector<aiMesh*> tmp(nmesh);
        InternSubdivide (out,nmesh,&tmp.front(),num-1);
        for (size_t i = 0; i < nmesh; ++i) {
            delete out[i];
            out[i] = tmp[i];
        }
    }
}